

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ani2h264raw.cpp
# Opt level: O0

void parse(int argc,char **argv)

{
  char *__s;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_00;
  Options *pOVar1;
  OptionAdder *pOVar2;
  element_type *peVar3;
  size_t sVar4;
  ostream *poVar5;
  OptionValue *pOVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7b8;
  OptionException *e;
  path local_6b0;
  allocator<char> local_681;
  string local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  string local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  pointer pbStack_620;
  pointer local_618;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5c8;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  undefined1 local_568 [8];
  ParseResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string local_498 [32];
  undefined1 local_478 [24];
  string local_460;
  shared_ptr<cxxopts::Value> local_440;
  shared_ptr<const_cxxopts::Value> local_430;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0 [32];
  shared_ptr<cxxopts::Value> local_380;
  shared_ptr<cxxopts::Value> local_370;
  shared_ptr<const_cxxopts::Value> local_360;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  shared_ptr<cxxopts::Value> local_2d8;
  shared_ptr<const_cxxopts::Value> local_2c8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  OptionAdder local_240;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_190 [8];
  Options options;
  char **argv_local;
  int argc_local;
  
  __s = *argv;
  options.m_option_map._M_h._M_single_bucket = (__node_base_ptr)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,__s,&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8," - ani files to h264 bitstream converter",&local_1e9);
  cxxopts::Options::Options((Options *)local_190,&local_1b0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"[optional args]",&local_211);
  pOVar1 = cxxopts::Options::positional_help((Options *)local_190,&local_210);
  cxxopts::Options::show_positional_help(pOVar1);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pOVar1 = cxxopts::Options::set_width((Options *)local_190,0x46);
  pOVar1 = cxxopts::Options::set_tab_expansion(pOVar1,true);
  pOVar1 = cxxopts::Options::allow_unrecognised_options(pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"",&local_261);
  cxxopts::Options::add_options(&local_240,pOVar1,&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"i,input",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Input",&local_2b1);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_2c8,&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"ANI file",&local_2f9);
  pOVar2 = cxxopts::OptionAdder::operator()(&local_240,&local_288,&local_2b0,&local_2c8,&local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"o,output",&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"Output file",&local_349);
  cxxopts::value<std::__cxx11::string>();
  peVar3 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"out.h264",&local_3a1);
  (*peVar3->_vptr_Value[10])(&local_370,peVar3,local_3a0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_360,&local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"raw H264 file",&local_3c9);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_320,&local_348,&local_360,&local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"help",&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"Print help",&local_419);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_430,&local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"",(allocator<char> *)(local_478 + 0x17));
  cxxopts::OptionAdder::operator()(pOVar2,&local_3f0,&local_418,&local_430,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)(local_478 + 0x17));
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_430);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_440);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_360);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_370);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_380);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_2c8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  cxxopts::OptionAdder::~OptionAdder(&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  result.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"input",
             (allocator<char> *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,"output",
             (allocator<char> *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  result.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  local_478._0_8_ = &local_4b8;
  local_478._8_8_ = 2;
  options_00._M_len = 2;
  options_00._M_array = (iterator)local_478._0_8_;
  cxxopts::Options::parse_positional((Options *)local_190,options_00);
  local_7b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478;
  do {
    local_7b8 = local_7b8 + -1;
    std::__cxx11::string::~string((string *)local_7b8);
  } while (local_7b8 != &local_4b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cxxopts::Options::parse
            ((ParseResult *)local_568,(Options *)local_190,argc,
             (char **)options.m_option_map._M_h._M_single_bucket);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"help",&local_589);
  sVar4 = cxxopts::ParseResult::count((ParseResult *)local_568,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  if (sVar4 != 0) {
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_5c8);
    cxxopts::Options::help(&local_5b0,(Options *)local_190,&local_5c8);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_5b0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5c8);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"input",&local_5e9);
  sVar4 = cxxopts::ParseResult::count((ParseResult *)local_568,&local_5e8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  if (sVar4 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_650,"input",(allocator<char> *)((long)&output + 7));
    pOVar6 = cxxopts::ParseResult::operator[]((ParseResult *)local_568,&local_650);
    pbVar7 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar6);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator((allocator<char> *)((long)&output + 7));
    local_630 = pbVar7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"output",&local_681);
    pOVar6 = cxxopts::ParseResult::operator[]((ParseResult *)local_568,&local_680);
    pbVar7 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar6);
    std::__cxx11::string::~string((string *)&local_680);
    std::allocator<char>::~allocator(&local_681);
    local_660 = pbVar7;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_6b0,local_630,auto_format);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&e,local_660,auto_format);
    ani::extract_ani_frames(&local_6b0,(path *)&e);
    std::filesystem::__cxx11::path::~path((path *)&e);
    std::filesystem::__cxx11::path::~path(&local_6b0);
    cxxopts::ParseResult::~ParseResult((ParseResult *)local_568);
    cxxopts::Options::~Options((Options *)local_190);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Specify input file");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  input = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pbStack_620 = (pointer)0x0;
  local_618 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&input);
  cxxopts::Options::help
            (&local_610,(Options *)local_190,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&input);
  poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_610);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_610);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&input);
  exit(0);
}

Assistant:

void parse(int argc, const char* argv[])
{
    try
    {
        cxxopts::Options options(argv[0], " - ani files to h264 bitstream converter");
        options
                .positional_help("[optional args]")
                .show_positional_help();

        options
                .set_width(70)
                .set_tab_expansion()
                .allow_unrecognised_options()
                .add_options()
                        ("i,input", "Input", cxxopts::value<std::string>(), "ANI file")
                        ("o,output", "Output file", cxxopts::value<std::string>()
                                ->default_value("out.h264"), "raw H264 file")
                        ("help", "Print help");

        options.parse_positional({"input", "output"});

        auto result = options.parse(argc, argv);

        if (result.count("help"))
        {
            std::cout << options.help() << std::endl;
            exit(0);
        }

        if (!result.count("input"))
        {
            std::cout << "Specify input file" << std::endl;
            std::cout << options.help() << std::endl;
            exit(0);
        }

        const auto &input = result["input"].as<std::string>();
        const auto &output = result["output"].as<std::string>();

        ani::extract_ani_frames(input, output);

    }
    catch (const cxxopts::OptionException& e)
    {
        std::cout << "error parsing options: " << e.what() << std::endl;
        exit(1);
    }
}